

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLog>
               (GetterYs<unsigned_short> *getter,TransformerLinLog *transformer,ImDrawList *DrawList
               ,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  float fVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  ImDrawList *this;
  int iVar9;
  int iVar10;
  ImPlotContext *gp;
  float fVar11;
  float fVar12;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  ImDrawList *local_80;
  ImVec2 local_78;
  undefined1 local_70 [8];
  TransformerLinLog *local_68;
  int local_60;
  ImU32 local_5c;
  float local_58;
  ImVec2 local_54;
  double local_48;
  double dStack_40;
  
  pIVar7 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_80 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar9 = getter->Count;
    local_60 = iVar9 + -1;
    local_58 = line_weight * 0.5;
    local_98 = getter->X0;
    uStack_90._0_4_ = getter->Offset;
    uStack_90._4_4_ = getter->Stride;
    local_a8 = getter->XScale;
    dStack_a0 = getter->X0;
    local_70 = (undefined1  [8])getter;
    local_68 = transformer;
    local_5c = col;
    dVar5 = log10((double)*(ushort *)
                           ((long)getter->Ys +
                           (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride)
                  / pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar9 = transformer->YAxis;
    pIVar4 = pIVar7->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar9].Range.Min;
    IVar3 = pIVar7->PixelRange[iVar9].Min;
    local_54.y = (float)(pIVar7->My[iVar9] *
                         ((dVar2 + (double)(float)(dVar5 / pIVar7->LogDenY[iVar9]) *
                                   (pIVar4->YAxis[iVar9].Range.Max - dVar2)) - dVar2) +
                        (double)IVar3.y);
    local_54.x = (float)(pIVar7->Mx * ((local_98 + local_a8 * 0.0) - (pIVar4->XAxis).Range.Min) +
                        (double)IVar3.x);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_short>,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::TransformerLinLog> *)
               local_70,local_80,&pIVar4->PlotRect);
  }
  else {
    local_98 = getter->X0;
    uStack_90._0_4_ = getter->Offset;
    uStack_90._4_4_ = getter->Stride;
    local_a8 = getter->XScale;
    dStack_a0 = getter->X0;
    iVar9 = getter->Count;
    dVar5 = log10((double)*(ushort *)
                           ((long)getter->Ys +
                           (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride)
                  / pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar9 = transformer->YAxis;
    pIVar4 = pIVar7->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar9].Range.Min;
    IVar3 = pIVar7->PixelRange[iVar9].Min;
    local_70._4_4_ =
         (float)(pIVar7->My[iVar9] *
                 ((dVar2 + (double)(float)(dVar5 / pIVar7->LogDenY[iVar9]) *
                           (pIVar4->YAxis[iVar9].Range.Max - dVar2)) - dVar2) + (double)IVar3.y);
    local_70._0_4_ =
         (float)(pIVar7->Mx * ((local_98 + local_a8 * 0.0) - (pIVar4->XAxis).Range.Min) +
                (double)IVar3.x);
    iVar9 = getter->Count;
    if (1 < iVar9) {
      iVar10 = 1;
      do {
        pIVar8 = GImPlot;
        local_98 = getter->X0;
        uStack_90._0_4_ = getter->Offset;
        uStack_90._4_4_ = getter->Stride;
        local_48 = getter->XScale;
        dStack_40 = getter->X0;
        local_a8 = (double)iVar10;
        dStack_a0 = 0.0;
        dVar5 = log10((double)*(ushort *)
                               ((long)getter->Ys +
                               (long)(((getter->Offset + iVar10) % iVar9 + iVar9) % iVar9) *
                               (long)getter->Stride) /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        this = local_80;
        iVar9 = transformer->YAxis;
        pIVar4 = pIVar8->CurrentPlot;
        dVar2 = pIVar4->YAxis[iVar9].Range.Min;
        IVar3 = pIVar8->PixelRange[iVar9].Min;
        fVar11 = (float)(pIVar8->Mx * ((local_98 + local_a8 * local_48) - (pIVar4->XAxis).Range.Min)
                        + (double)IVar3.x);
        fVar12 = (float)(pIVar8->My[iVar9] *
                         ((dVar2 + (double)(float)(dVar5 / pIVar8->LogDenY[iVar9]) *
                                   (pIVar4->YAxis[iVar9].Range.Max - dVar2)) - dVar2) +
                        (double)IVar3.y);
        local_78.y = fVar12;
        local_78.x = fVar11;
        pIVar4 = pIVar7->CurrentPlot;
        fVar6 = (float)local_70._4_4_;
        if (fVar12 <= (float)local_70._4_4_) {
          fVar6 = fVar12;
        }
        if ((fVar6 < (pIVar4->PlotRect).Max.y) &&
           (fVar6 = (float)(~-(uint)(fVar12 <= (float)local_70._4_4_) & (uint)fVar12 |
                           -(uint)(fVar12 <= (float)local_70._4_4_) & local_70._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar6 && fVar6 != *pfVar1)) {
          fVar6 = (float)local_70._0_4_;
          if (fVar11 <= (float)local_70._0_4_) {
            fVar6 = fVar11;
          }
          if ((fVar6 < (pIVar4->PlotRect).Max.x) &&
             (fVar6 = (float)(-(uint)(fVar11 <= (float)local_70._0_4_) & local_70._0_4_ |
                             ~-(uint)(fVar11 <= (float)local_70._0_4_) & (uint)fVar11),
             (pIVar4->PlotRect).Min.x <= fVar6 && fVar6 != (pIVar4->PlotRect).Min.x)) {
            local_b0.y = (float)local_70._4_4_;
            local_b0.x = fVar11;
            ImDrawList::AddLine(local_80,(ImVec2 *)local_70,&local_b0,col,line_weight);
            ImDrawList::AddLine(this,&local_b0,&local_78,col,line_weight);
          }
        }
        iVar10 = iVar10 + 1;
        iVar9 = getter->Count;
        local_70 = (undefined1  [8])local_78;
      } while (iVar10 < iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}